

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_impl_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe local_68;
  secp256k1_modinv64_signed62 local_40;
  
  local_68.n[4] = x->n[4];
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  secp256k1_fe_impl_normalize(&local_68);
  secp256k1_fe_to_signed62(&local_40,&local_68);
  secp256k1_modinv64(&local_40,&secp256k1_const_modinfo_fe);
  secp256k1_fe_from_signed62(r,&local_40);
  return;
}

Assistant:

static void secp256k1_fe_impl_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    secp256k1_fe tmp = *x;
    secp256k1_modinv64_signed62 s;

    secp256k1_fe_normalize(&tmp);
    secp256k1_fe_to_signed62(&s, &tmp);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_fe);
    secp256k1_fe_from_signed62(r, &s);
}